

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O0

exr_result_t
extract_attr_preview
          (exr_context_t ctxt,_internal_exr_seq_scratch *scratch,exr_attr_preview_t *attrdata,
          char *aname,char *tname,int32_t attrsz)

{
  exr_attr_preview_t *peVar1;
  int iVar2;
  uint32_t h;
  uint32_t w;
  exr_attr_preview_t *p;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  int in_R9D;
  int64_t fsize;
  exr_result_t rv;
  uint32_t sz [2];
  uint64_t bytes;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  exr_result_t local_4;
  
  peVar1 = *(exr_attr_preview_t **)(in_RDI + 0x98);
  exr_attr_preview_destroy
            ((exr_context_t)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (exr_attr_preview_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (in_R9D < 8) {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,0x11,"Attribute \'%s\': Invalid size %d (exp \'%s\' size >= 8)",
                         in_RCX,in_R9D,in_R8);
  }
  else {
    iVar2 = (**(code **)(in_RSI + 0x20))(in_RSI,&stack0xffffffffffffffb8,8);
    if (iVar2 == 0) {
      h = one_to_native32(0);
      w = one_to_native32(0);
      p = (exr_attr_preview_t *)(ulong)(h * 4 * w);
      if ((size_t *)(long)in_R9D == &p->alloc_size) {
        if ((p == (exr_attr_preview_t *)0x0) || ((0 < (long)peVar1 && (peVar1 <= p)))) {
          local_4 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,0x11,
                               "Attribute \'%s\', type \'%s\': Invalid size for preview %u x %u",
                               in_RCX,in_R8,h,w);
        }
        else {
          local_4 = exr_attr_preview_init
                              ((exr_context_t)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),p,w,h);
          if ((local_4 == 0) && (p != (exr_attr_preview_t *)0x0)) {
            iVar2 = (**(code **)(in_RSI + 0x20))(in_RSI,*(undefined8 *)(in_RDX + 0x10),h * w * 4);
            if (iVar2 == 0) {
              local_4 = 0;
            }
            else {
              exr_attr_preview_destroy
                        ((exr_context_t)CONCAT44(w,h),
                         (exr_attr_preview_t *)CONCAT44(iVar2,in_stack_ffffffffffffffb0));
              local_4 = (**(code **)(in_RDI + 0x48))
                                  (in_RDI,iVar2,
                                   "Attribute \'%s\': Unable to read preview data (%d bytes)",in_RCX
                                   ,in_R9D);
            }
          }
        }
      }
      else {
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,0xe,
                             "Attribute \'%s\': Invalid size %d (exp \'%s\' %u x %u * 4 + sizevals)"
                             ,in_RCX,in_R9D,in_R8,h,w);
      }
    }
    else {
      local_4 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,iVar2,"Attribute \'%s\': Unable to read preview sizes",in_RCX);
    }
  }
  return local_4;
}

Assistant:

static exr_result_t
extract_attr_preview (
    exr_context_t                     ctxt,
    struct _internal_exr_seq_scratch* scratch,
    exr_attr_preview_t*               attrdata,
    const char*                       aname,
    const char*                       tname,
    int32_t                           attrsz)
{
    uint64_t     bytes;
    uint32_t     sz[2];
    exr_result_t rv;
    int64_t      fsize = ctxt->file_size;

    /* mostly for fuzzing, but just in case there's a duplicate name */
    exr_attr_preview_destroy (ctxt, attrdata);

    if (attrsz < 8)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s': Invalid size %d (exp '%s' size >= 8)",
            aname,
            attrsz,
            tname);

    rv = scratch->sequential_read (scratch, sz, sizeof (uint32_t) * 2);
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt, rv, "Attribute '%s': Unable to read preview sizes", aname);

    sz[0] = one_to_native32 (sz[0]);
    sz[1] = one_to_native32 (sz[1]);
    bytes = 4 * sz[0] * sz[1];
    if ((uint64_t) attrsz != (8 + bytes))
        return ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ATTR,
            "Attribute '%s': Invalid size %d (exp '%s' %u x %u * 4 + sizevals)",
            aname,
            attrsz,
            tname,
            sz[0],
            sz[1]);

    if (bytes == 0 || (fsize > 0 && bytes >= (uint64_t) fsize))
    {
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ATTR_SIZE_MISMATCH,
            "Attribute '%s', type '%s': Invalid size for preview %u x %u",
            aname,
            tname,
            sz[0],
            sz[1]);
    }

    rv = exr_attr_preview_init (ctxt, attrdata, sz[0], sz[1]);
    if (rv != EXR_ERR_SUCCESS) return rv;

    if (bytes > 0)
    {
        rv = scratch->sequential_read (
            scratch, EXR_CONST_CAST (void*, attrdata->rgba), sz[0] * sz[1] * 4);
        if (rv != EXR_ERR_SUCCESS)
        {
            exr_attr_preview_destroy (ctxt, attrdata);
            return ctxt->print_error (
                ctxt,
                rv,
                "Attribute '%s': Unable to read preview data (%d bytes)",
                aname,
                attrsz);
        }
    }

    return rv;
}